

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O3

int Rct::readLine(FILE *f,char *buf,int max)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char bufbuf [16384];
  char acStack_4008 [16384];
  
  pcVar2 = acStack_4008;
  if (buf != (char *)0x0) {
    pcVar2 = buf;
  }
  iVar1 = 0x4000;
  if (buf != (char *)0x0) {
    iVar1 = max;
  }
  pcVar2 = fgets(pcVar2,iVar1,(FILE *)f);
  if (pcVar2 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar3 = strlen(pcVar2);
    iVar1 = (int)sVar3;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else if (pcVar2[iVar1 + -1] == '\n') {
      pcVar2[(long)iVar1 + -1] = '\0';
      iVar1 = iVar1 + -1;
    }
  }
  return iVar1;
}

Assistant:

int readLine(FILE *f, char *buf, int max)
{
    char bufbuf[16384];
    if (!buf)
        max = sizeof(bufbuf);
    char *ret = fgets(buf ? buf : bufbuf, max, f);
    if (ret) {
        int len = strlen(ret);
        if (len && ret[len - 1] == '\n') {
            ret[--len] = '\0';
        }
        return len;
    }
    return -1;
}